

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_mixer.c
# Opt level: O0

_Bool al_attach_mixer_to_mixer(ALLEGRO_MIXER *stream,ALLEGRO_MIXER *mixer)

{
  char *in_RSI;
  long in_RDI;
  int error;
  _Bool local_1;
  
  error = (int)((ulong)in_RDI >> 0x20);
  if (*(int *)(in_RSI + 0x88) == *(int *)(in_RDI + 0x88)) {
    if (*(int *)(in_RSI + 0x80) == *(int *)(in_RDI + 0x80)) {
      if (*(int *)(in_RSI + 0x84) == *(int *)(in_RDI + 0x84)) {
        local_1 = al_attach_sample_instance_to_mixer(&stream->ss,mixer);
      }
      else {
        _al_set_error(error,in_RSI);
        local_1 = false;
      }
    }
    else {
      _al_set_error(error,in_RSI);
      local_1 = false;
    }
  }
  else {
    _al_set_error(error,in_RSI);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool al_attach_mixer_to_mixer(ALLEGRO_MIXER *stream, ALLEGRO_MIXER *mixer)
{
   ASSERT(mixer);
   ASSERT(stream);
   ASSERT(mixer != stream);

   if (mixer->ss.spl_data.frequency != stream->ss.spl_data.frequency) {
      _al_set_error(ALLEGRO_INVALID_OBJECT,
         "Attempted to attach a mixer with different frequencies");
      return false;
   }

   if (mixer->ss.spl_data.depth != stream->ss.spl_data.depth) {
      _al_set_error(ALLEGRO_INVALID_OBJECT,
         "Mixers of different audio depths cannot be attached to one another");
      return false;
   }

   if (mixer->ss.spl_data.chan_conf != stream->ss.spl_data.chan_conf) {
      _al_set_error(ALLEGRO_INVALID_OBJECT,
         "Mixers of different channel configurations cannot be attached to one another");
      return false;
   }

   return al_attach_sample_instance_to_mixer(&stream->ss, mixer);
}